

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::TessEvaluationExecutor::execute
          (TessEvaluationExecutor *this,int numValues,void **inputs,void **outputs,
          VkDescriptorSet extraResources)

{
  deUint32 numValues_00;
  int alignedValues;
  int patchSize;
  void **outputs_local;
  void **inputs_local;
  int numValues_local;
  TessEvaluationExecutor *this_local;
  VkDescriptorSet extraResources_local;
  
  numValues_00 = deAlign32(numValues,2);
  BufferIoExecutor::initBuffers((BufferIoExecutor *)this,numValues_00);
  BufferIoExecutor::uploadInputBuffer((BufferIoExecutor *)this,inputs,numValues);
  TessellationExecutor::renderTess
            (&this->super_TessellationExecutor,numValues_00,numValues_00,2,extraResources);
  BufferIoExecutor::readOutputBuffer((BufferIoExecutor *)this,outputs,numValues);
  return;
}

Assistant:

void TessEvaluationExecutor::execute (int numValues, const void* const* inputs, void* const* outputs, VkDescriptorSet extraResources)
{
	const int	patchSize		= 2;
	const int	alignedValues	= deAlign32(numValues, patchSize);

	// Initialize buffers with aligned value count to make room for padding
	initBuffers(alignedValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	renderTess((deUint32)alignedValues, (deUint32)alignedValues, (deUint32)patchSize, extraResources);

	// Read back data
	readOutputBuffer(outputs, numValues);
}